

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O3

void writeSol(char *fout,cupdlp_int nCols,cupdlp_int nRows,cupdlp_float *col_value,
             cupdlp_float *col_dual,cupdlp_float *row_value,cupdlp_float *row_dual)

{
  FILE *__stream;
  ulong uVar1;
  
  puts("--------------------------------");
  printf("--- saving sol to %s\n",fout);
  puts("--------------------------------");
  __stream = fopen(fout,"w");
  fputc(0x7b,__stream);
  fputc(10,__stream);
  fprintf(__stream,"\"nCols\": %d",nCols);
  fwrite(",\n",2,1,__stream);
  fprintf(__stream,"\"nRows\": %d",(ulong)(uint)nRows);
  fwrite(",\n",2,1,__stream);
  fwrite("\"col_value\": [",0xe,1,__stream);
  if (nCols != 0 && col_value != (cupdlp_float *)0x0) {
    if (1 < nCols) {
      uVar1 = 0;
      do {
        fprintf(__stream,"%.14f,",col_value[uVar1]);
        uVar1 = uVar1 + 1;
      } while (nCols - 1U != uVar1);
    }
    fprintf(__stream,"%.14f",col_value[(int)(nCols - 1U)]);
  }
  fputc(0x5d,__stream);
  fwrite(",\n",2,1,__stream);
  fwrite("\"col_dual\": [",0xd,1,__stream);
  if (col_dual != (cupdlp_float *)0x0 && nCols != 0) {
    if (1 < nCols) {
      uVar1 = 0;
      do {
        fprintf(__stream,"%.14f,",col_dual[uVar1]);
        uVar1 = uVar1 + 1;
      } while (nCols - 1U != uVar1);
    }
    fprintf(__stream,"%.14f",col_dual[(int)(nCols - 1U)]);
  }
  fputc(0x5d,__stream);
  fwrite(",\n",2,1,__stream);
  fwrite("\"row_value\": [",0xe,1,__stream);
  if (nRows != 0 && row_value != (cupdlp_float *)0x0) {
    if (1 < nRows) {
      uVar1 = 0;
      do {
        fprintf(__stream,"%.14f,",row_value[uVar1]);
        uVar1 = uVar1 + 1;
      } while (nRows - 1U != uVar1);
    }
    fprintf(__stream,"%.14f",row_value[(int)(nRows - 1U)]);
  }
  fputc(0x5d,__stream);
  fwrite(",\n",2,1,__stream);
  fwrite("\"row_dual\": [",0xd,1,__stream);
  if (row_dual != (cupdlp_float *)0x0 && nRows != 0) {
    if (1 < nRows) {
      uVar1 = 0;
      do {
        fprintf(__stream,"%.14f,",row_dual[uVar1]);
        uVar1 = uVar1 + 1;
      } while (nRows - 1U != uVar1);
    }
    fprintf(__stream,"%.14f",row_dual[(int)(nRows - 1U)]);
  }
  fputc(0x5d,__stream);
  fputc(10,__stream);
  fputc(0x7d,__stream);
  fclose(__stream);
  return;
}

Assistant:

void writeSol(const char *fout, cupdlp_int nCols, cupdlp_int nRows,
              cupdlp_float *col_value, cupdlp_float *col_dual,
              cupdlp_float *row_value, cupdlp_float *row_dual) {
  FILE *fptr;

  cupdlp_printf("--------------------------------\n");
  cupdlp_printf("--- saving sol to %s\n", fout);
  cupdlp_printf("--------------------------------\n");
  // Open a file in writing mode
  fptr = fopen(fout, "w");
  fprintf(fptr, "{");

  // nCols
  fprintf(fptr, "\n");

  fprintf(fptr, "\"nCols\": %d", nCols);

  // nRows
  fprintf(fptr, ",\n");

  fprintf(fptr, "\"nRows\": %d", nRows);

  // col value
  fprintf(fptr, ",\n");

  fprintf(fptr, "\"col_value\": [");
  if (col_value && nCols) {
    for (int i = 0; i < nCols - 1; ++i) {
      fprintf(fptr, "%.14f,", col_value[i]);
    }
    fprintf(fptr, "%.14f", col_value[nCols - 1]);
  }
  fprintf(fptr, "]");

  // col dual
  fprintf(fptr, ",\n");
  fprintf(fptr, "\"col_dual\": [");
  if (col_dual && nCols) {
    for (int i = 0; i < nCols - 1; ++i) {
      fprintf(fptr, "%.14f,", col_dual[i]);
    }
    fprintf(fptr, "%.14f", col_dual[nCols - 1]);
  }
  fprintf(fptr, "]");

  // row value
  fprintf(fptr, ",\n");
  fprintf(fptr, "\"row_value\": [");
  if (row_value && nRows) {
    for (int i = 0; i < nRows - 1; ++i) {
      fprintf(fptr, "%.14f,", row_value[i]);
    }
    fprintf(fptr, "%.14f", row_value[nRows - 1]);
  }
  fprintf(fptr, "]");

  // row dual
  fprintf(fptr, ",\n");
  fprintf(fptr, "\"row_dual\": [");
  if (row_dual && nRows) {
    for (int i = 0; i < nRows - 1; ++i) {
      fprintf(fptr, "%.14f,", row_dual[i]);
    }
    fprintf(fptr, "%.14f", row_dual[nRows - 1]);
  }
  fprintf(fptr, "]");

  // end writing
  fprintf(fptr, "\n");
  fprintf(fptr, "}");

  // Close the file
  fclose(fptr);
}